

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

string * __thiscall
pbrt::ParameterDictionary::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ParameterDictionary *this)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  RGBColorSpace *this_00;
  char **in_RCX;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[ ParameterDictionary params: ",
             (allocator<char> *)&local_70);
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar3 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar3 = paVar1;
  }
  for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    ParsedParameter::ToString_abi_cxx11_(&local_50,*(ParsedParameter **)((long)paVar3 + lVar4));
    std::operator+(&local_90,"[ ",&local_50);
    std::operator+(&local_70,&local_90,"] ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  this_00 = this->colorSpace;
  if (this_00 == (RGBColorSpace *)0x0) {
    local_90._M_dataplus._M_p = "<nullptr>";
  }
  else {
    RGBColorSpace::ToString_abi_cxx11_(&local_90,this_00);
  }
  local_50._M_dataplus._M_p = local_90._M_dataplus._M_p;
  StringPrintf<char_const*>(&local_70,(pbrt *)"colorSpace: %s ",(char *)&local_50,in_RCX);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_70);
  if (this_00 != (RGBColorSpace *)0x0) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ParameterDictionary::ToString() const {
    std::string s = "[ ParameterDictionary params: ";
    for (const ParsedParameter *p : params) {
        s += "[ " + p->ToString() + "] ";
    }
    s += StringPrintf("colorSpace: %s ",
                      colorSpace ? colorSpace->ToString().c_str() : "<nullptr>");
    s += "]";
    return s;
}